

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::ObjectInstance(ParsedScene *this,string *name,FileLoc loc)

{
  Float startTime;
  FileLoc loc_00;
  FileLoc loc_01;
  size_t sVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  Transform *renderFromInstance;
  char *pcVar5;
  Transform worldFromRender;
  InstanceSceneEntity local_7c8;
  Transform local_468;
  Transform local_3e8;
  Transform local_368;
  AnimatedTransform animatedRenderFromInstance;
  
  if (this->currentApiState == OptionsBlock) {
    pcVar5 = "Scene description must be inside world block; \"%s\" not allowed. Ignoring.";
  }
  else {
    if (this->currentApiState != Uninitialized) {
      if (this->currentInstance != (InstanceDefinitionSceneEntity *)0x0) {
        (this->super_SceneRepresentation).errorExit = true;
        Error(&loc,"ObjectInstance can\'t be called inside instance definition");
        return;
      }
      worldFromRender.m.m[0]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[0];
      worldFromRender.m.m[0]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[0] + 2);
      worldFromRender.m.m[1]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[1];
      worldFromRender.m.m[1]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[1] + 2);
      worldFromRender.m.m[2]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[2];
      worldFromRender.m.m[2]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[2] + 2);
      worldFromRender.m.m[3]._0_8_ = *(undefined8 *)(this->renderFromWorld).mInv.m[3];
      worldFromRender.m.m[3]._8_8_ = *(undefined8 *)((this->renderFromWorld).mInv.m[3] + 2);
      worldFromRender.mInv.m[0]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[0];
      worldFromRender.mInv.m[0]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[0] + 2);
      worldFromRender.mInv.m[1]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[1];
      worldFromRender.mInv.m[1]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[1] + 2);
      worldFromRender.mInv.m[2]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[2];
      worldFromRender.mInv.m[2]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[2] + 2);
      worldFromRender.mInv.m[3]._0_8_ = *(undefined8 *)(this->renderFromWorld).m.m[3];
      worldFromRender.mInv.m[3]._8_8_ = *(undefined8 *)((this->renderFromWorld).m.m[3] + 2);
      bVar4 = TransformSet::IsAnimated(&this->curTransform);
      if (bVar4) {
        GetCTM(&local_368,this,0);
        pbrt::Transform::operator*((Transform *)&local_7c8,&local_368,&worldFromRender);
        startTime = this->transformStartTime;
        GetCTM(&local_468,this,1);
        pbrt::Transform::operator*(&local_3e8,&local_468,&worldFromRender);
        AnimatedTransform::AnimatedTransform
                  (&animatedRenderFromInstance,(Transform *)&local_7c8,startTime,&local_3e8,
                   this->transformEndTime);
        loc_00.filename._M_str = loc.filename._M_str;
        loc_00.filename._M_len = loc.filename._M_len;
        loc_00.line = loc.line;
        loc_00.column = loc.column;
        InstanceSceneEntity::InstanceSceneEntity
                  (&local_7c8,name,loc_00,&animatedRenderFromInstance,(Transform *)0x0);
        std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::
        emplace_back<pbrt::InstanceSceneEntity>(&this->instances,&local_7c8);
      }
      else {
        GetCTM(&animatedRenderFromInstance.startTransform,this,0);
        pbrt::Transform::operator*
                  ((Transform *)&local_7c8,&animatedRenderFromInstance.startTransform,
                   &worldFromRender);
        renderFromInstance = TransformCache::Lookup(&this->transformCache,(Transform *)&local_7c8);
        uVar2 = loc._16_8_;
        pcVar5 = loc.filename._M_str;
        sVar1 = loc.filename._M_len;
        memset(&animatedRenderFromInstance,0,0x2b8);
        AnimatedTransform::AnimatedTransform(&animatedRenderFromInstance);
        uVar3 = loc._16_8_;
        loc_01.filename._M_str = pcVar5;
        loc_01.filename._M_len = sVar1;
        loc.line = (int)uVar2;
        loc.column = SUB84(uVar2,4);
        loc_01.line = loc.line;
        loc_01.column = loc.column;
        loc._16_8_ = uVar3;
        InstanceSceneEntity::InstanceSceneEntity
                  (&local_7c8,name,loc_01,&animatedRenderFromInstance,renderFromInstance);
        std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::
        emplace_back<pbrt::InstanceSceneEntity>(&this->instances,&local_7c8);
      }
      SceneEntity::~SceneEntity(&local_7c8.super_SceneEntity);
      return;
    }
    pcVar5 = "pbrtInit() must be before calling \"%s()\". Ignoring.";
  }
  Error<char_const(&)[15]>(&loc,pcVar5,(char (*) [15])"ObjectInstance");
  return;
}

Assistant:

void ParsedScene::ObjectInstance(const std::string &name, FileLoc loc) {
    VERIFY_WORLD("ObjectInstance");

    if (currentInstance != nullptr) {
        ErrorExitDeferred(&loc,
                          "ObjectInstance can't be called inside instance definition");
        return;
    }

    class Transform worldFromRender = Inverse(renderFromWorld);

    if (CTMIsAnimated()) {
        AnimatedTransform animatedRenderFromInstance(
            GetCTM(0) * worldFromRender, transformStartTime, GetCTM(1) * worldFromRender,
            transformEndTime);

        instances.push_back(
            InstanceSceneEntity(name, loc, animatedRenderFromInstance, nullptr));
    } else {
        const class Transform *renderFromInstance =
            transformCache.Lookup(GetCTM(0) * worldFromRender);

        instances.push_back(
            InstanceSceneEntity(name, loc, AnimatedTransform(), renderFromInstance));
    }
}